

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcargscontext_p.h
# Opt level: O3

void __thiscall
asmjit::FuncArgsContext::WorkData::reassign
          (WorkData *this,uint32_t varId,uint32_t newId,uint32_t oldId)

{
  uint uVar1;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint8_t uVar2;
  uint in_R8D;
  
  if (oldId < 0x20) {
    in_R8D = this->_assignedRegs;
    if ((in_R8D >> (oldId & 0x1f) & 1) == 0) goto LAB_00117912;
    oldId = oldId;
    if (0x1f < newId) goto LAB_00117917;
    if ((in_R8D >> (newId & 0x1f) & 1) != 0) goto LAB_0011791c;
    uVar1 = (uint)this->_physToVarId[oldId];
    if (this->_physToVarId[oldId] != varId) goto LAB_00117921;
    if (this->_physToVarId[newId] == 0xff) {
      this->_physToVarId[oldId] = 0xff;
      this->_physToVarId[newId] = (uint8_t)varId;
      this->_assignedRegs = 1 << ((byte)oldId & 0x1f) ^ 1 << ((byte)newId & 0x1f) ^ in_R8D;
      return;
    }
  }
  else {
    reassign();
LAB_00117912:
    reassign();
LAB_00117917:
    newId = oldId;
    reassign();
LAB_0011791c:
    reassign();
    uVar1 = newId;
LAB_00117921:
    newId = uVar1;
    reassign();
  }
  reassign();
  if (extraout_EDX < 0x20) {
    if ((this->_assignedRegs >> (extraout_EDX & 0x1f) & 1) == 0) goto LAB_0011796f;
    if (0x1f < in_R8D) goto LAB_00117974;
    if ((this->_assignedRegs >> (in_R8D & 0x1f) & 1) == 0) goto LAB_00117979;
    if (this->_physToVarId[extraout_EDX] != varId) goto LAB_0011797e;
    if (this->_physToVarId[in_R8D] == newId) {
      this->_physToVarId[extraout_EDX] = (uint8_t)newId;
      this->_physToVarId[in_R8D] = (uint8_t)varId;
      return;
    }
  }
  else {
    swap();
LAB_0011796f:
    swap();
LAB_00117974:
    swap();
LAB_00117979:
    swap();
LAB_0011797e:
    swap();
  }
  uVar2 = (uint8_t)varId;
  swap();
  if (extraout_EDX_00 < 0x20) {
    uVar1 = this->_assignedRegs;
    if ((uVar1 >> (extraout_EDX_00 & 0x1f) & 1) == 0) {
      if (this->_physToVarId[extraout_EDX_00] == 0xff) {
        this->_physToVarId[extraout_EDX_00] = uVar2;
        this->_assignedRegs = uVar1 ^ 1 << ((byte)extraout_EDX_00 & 0x1f);
        return;
      }
      goto LAB_001179c1;
    }
  }
  else {
    assign();
  }
  assign();
LAB_001179c1:
  assign();
  *(undefined ***)this = &PTR__BaseEmitter_00154660;
  *(uint8_t *)&this->_usedRegs = uVar2;
  this->_assignedRegs = 0;
  this->_dstRegs = 1;
  *(undefined4 *)((long)&this->_usedRegs + 1) = 0;
  this->_dstShuf = 0;
  this->_numSwaps = '\0';
  this->_numStackArgs = '\0';
  this->_reserved[0] = '\0';
  this->_reserved[1] = '\0';
  *(undefined8 *)(this->_reserved + 2) = 0;
  this->_physToVarId[4] = '\0';
  this->_physToVarId[5] = '\0';
  this->_physToVarId[6] = '\0';
  this->_physToVarId[7] = '\0';
  this->_physToVarId[8] = '\0';
  this->_physToVarId[9] = '\0';
  this->_physToVarId[10] = '\0';
  this->_physToVarId[0xb] = '\0';
  this->_physToVarId[0xc] = '\0';
  this->_physToVarId[0xd] = '\0';
  this->_physToVarId[0xe] = '\0';
  this->_physToVarId[0xf] = '\0';
  this->_physToVarId[0x10] = '\0';
  this->_physToVarId[0x11] = '\0';
  this->_physToVarId[0x12] = '\0';
  this->_physToVarId[0x13] = '\0';
  this->_physToVarId[0x14] = '\0';
  this->_physToVarId[0x15] = '\0';
  this->_physToVarId[0x16] = '\0';
  this->_physToVarId[0x17] = '\0';
  this->_physToVarId[0x18] = '\0';
  this->_physToVarId[0x19] = '\0';
  this->_physToVarId[0x1a] = '\0';
  this->_physToVarId[0x1b] = '\0';
  *(undefined8 *)(this->_physToVarId + 0x1c) = 0;
  this[1]._archRegs = 0;
  this[1]._workRegs = 0;
  this[1]._usedRegs = 0;
  this[1]._assignedRegs = 0;
  return;
}

Assistant:

inline void reassign(uint32_t varId, uint32_t newId, uint32_t oldId) noexcept {
      ASMJIT_ASSERT( isAssigned(oldId));
      ASMJIT_ASSERT(!isAssigned(newId));
      ASMJIT_ASSERT(_physToVarId[oldId] == varId);
      ASMJIT_ASSERT(_physToVarId[newId] == kVarIdNone);

      _physToVarId[oldId] = uint8_t(kVarIdNone);
      _physToVarId[newId] = uint8_t(varId);
      _assignedRegs ^= Support::bitMask(newId) ^ Support::bitMask(oldId);
    }